

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void __thiscall IDisk::WriteBit(IDisk *this,int side,int track,uchar bit)

{
  byte local_19;
  uchar bit_local;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  local_19 = bit;
  if (this->head_position_ == 0) {
    local_19 = bit | 2;
  }
  if (this->head_position_ < this->side_[side].tracks[track].size) {
    this->side_[side].tracks[track].bitfield[this->head_position_] = local_19;
  }
  this->disk_modified_ = true;
  this->head_position_ = this->head_position_ + 1;
  if (this->side_[side].tracks[track].size <= this->head_position_) {
    this->head_position_ = 0;
  }
  return;
}

Assistant:

void IDisk::WriteBit(int side, int track, unsigned char bit)
{
   if (head_position_ == 0)
   {
      bit |= BIT_INDEX;
   }

   if (head_position_ < side_[side].tracks[track].size)
      side_[side].tracks[track].bitfield[head_position_] = bit;

   disk_modified_ = true;

   // Weak bit : TO DO

   // Get next bit
   ++head_position_;
   if (head_position_ >= side_[side].tracks[track].size)
   {
      head_position_ = 0;
   }
}